

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
::ConcreteMachine(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
                  *this,Target *target,ROMFetcher *rom_fetcher)

{
  int iVar1;
  bool bVar2;
  undefined4 *puVar3;
  pointer this_00;
  pointer ppVar4;
  uchar *puVar5;
  ulong uVar6;
  key_type local_1ac;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1a8;
  _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1a0;
  undefined1 local_198 [16];
  _Self local_188;
  key_type local_17c;
  _Self local_178;
  iterator colour_rom;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request local_118;
  Request local_f0;
  Request local_c8;
  key_type local_9c;
  undefined1 local_98 [4];
  Name basic;
  Request request;
  size_t c;
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_58;
  Cycles local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
  *this_local;
  
  local_20.super_WrappedInt<Cycles>.length_ = (WrappedInt<Cycles>)(WrappedInt<Cycles>)rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  MachineTypes::JoystickMachine::JoystickMachine(&this->super_JoystickMachine);
  MachineTypes::MediaTarget::MediaTarget(&this->super_MediaTarget);
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_58);
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,&local_58);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_58);
  Configurable::Device::Device(&this->super_Device);
  MOS::MOS6522::IRQDelegatePortHandler::Delegate::Delegate(&this->super_Delegate);
  Storage::Tape::BinaryTapePlayer::Delegate::Delegate(&this->super_Delegate);
  DiskController::Delegate::Delegate(&this->super_Delegate);
  Activity::Source::Source(&this->super_Source);
  Oric::Machine::Machine(&this->super_Machine);
  Oric::Keyboard::SpecialKeyHandler::SpecialKeyHandler(&this->super_SpecialKeyHandler);
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca5a80;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca5b78;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca5bb0;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00ca5bc8;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca5be0;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca5bf8;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca5c28;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca5c68;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00ca5c88;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00ca5ca0;
  (this->super_Delegate).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_wd1770_did_change_output_00ca5cb8;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00ca5cd8;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca5cf0;
  (this->super_SpecialKeyHandler)._vptr_SpecialKeyHandler = (_func_int **)&DAT_00ca5d10;
  this->basic_invisible_ram_top_ = 0xffff;
  this->basic_visible_ram_top_ = 0xbfff;
  CPU::MOS6502Esque::
  Processor<(CPU::MOS6502Esque::Type)1,_Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>,_false>
  ::Processor(&this->m6502_,this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->rom_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->disk_rom_);
  this->tape_get_byte_address_ = 0;
  this->tape_speed_address_ = 0;
  this->keyboard_read_count_ = 0;
  JustInTimeActor<Oric::VideoOutput,Cycles,1,1>::JustInTimeActor<unsigned_char(&)[65536]>
            ((JustInTimeActor<Oric::VideoOutput,Cycles,1,1> *)&this->video_,&this->ram_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  GI::AY38910::AY38910<false>::AY38910SampleSource(&this->ay8910_,AY38910,&this->audio_queue_);
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass
            (&this->speaker_,&this->ay8910_);
  Oric::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_);
  TapePlayer::TapePlayer(&this->tape_player_);
  this->use_fast_tape_hack_ = false;
  VIAPortHandler::VIAPortHandler
            (&this->via_port_handler_,&this->audio_queue_,&this->ay8910_,&this->speaker_,
             &this->tape_player_,&this->keyboard_);
  MOS::MOS6522::MOS6522<Oric::VIAPortHandler>::MOS6522(&this->via_,&this->via_port_handler_);
  Oric::Keyboard::Keyboard(&this->keyboard_,&this->super_SpecialKeyHandler);
  Microdisc::Microdisc(&this->microdisc_);
  Jasmin::Jasmin(&this->jasmin_);
  this->jasmin_reset_counter_ = 0;
  BD500::BD500(&this->bd500_);
  c._0_4_ = 2000000;
  JustInTimeActor<Apple::DiskII,_Cycles,_1,_1>::JustInTimeActor<int>(&this->diskii_,(int *)&c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->pravetz_rom_);
  this->pravetz_rom_base_pointer_ = 0;
  this->ram_top_ = this->basic_visible_ram_top_;
  this->paged_rom_ = (uint8_t *)0x0;
  std::unique_ptr<Utility::StringSerialiser,std::default_delete<Utility::StringSerialiser>>::
  unique_ptr<std::default_delete<Utility::StringSerialiser>,void>
            ((unique_ptr<Utility::StringSerialiser,std::default_delete<Utility::StringSerialiser>> *
             )&this->string_serialiser_);
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,1000000.0);
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
  ::set_input_rate(&(this->speaker_).
                    super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                   ,1e+06);
  MOS::MOS6522::IRQDelegatePortHandler::set_interrupt_delegate
            (&(this->via_port_handler_).super_IRQDelegatePortHandler,&this->super_Delegate);
  Storage::Tape::BinaryTapePlayer::set_delegate
            (&(this->tape_player_).super_BinaryTapePlayer,&this->super_Delegate);
  Memory::Fuzz(this->ram_,0x10000);
  for (request.node.children.
       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      request.node.children.
      super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)0x10000;
      request.node.children.
      super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(request.node.children.
                             super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->type + 1)) {
    this->ram_
    [(long)request.node.children.
           super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage] =
         this->ram_
         [(long)request.node.children.
                super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage] | 0x40;
  }
  ROM::Request::Request((Request *)local_98,OricColourROM,true);
  iVar1 = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 8);
  if (iVar1 == 0) {
    local_9c = OricBASIC10;
  }
  else if ((iVar1 == 1) || (iVar1 != 2)) {
    local_9c = OricBASIC11;
  }
  else {
    local_9c = OricPravetzBASIC;
  }
  ROM::Request::Request(&local_f0,local_9c,false);
  ROM::Request::operator&&(&local_c8,(Request *)local_98,&local_f0);
  ROM::Request::operator=((Request *)local_98,&local_c8);
  ROM::Request::~Request(&local_c8);
  ROM::Request::~Request(&local_f0);
  ROM::Request::Request
            ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,OricByteDrive500,
             false);
  ROM::Request::operator&&
            (&local_118,(Request *)local_98,
             (Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ROM::Request::operator=((Request *)local_98,&local_118);
  ROM::Request::~Request(&local_118);
  ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&colour_rom,
               (function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
                *)local_20.super_WrappedInt<Cycles>.length_,(Request *)local_98);
  bVar2 = ROM::Request::validate((Request *)local_98,(Map *)&colour_rom);
  if (bVar2) {
    local_17c = OricColourROM;
    local_178._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)&colour_rom,&local_17c);
    local_188._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::end((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&colour_rom);
    bVar2 = std::operator!=(&local_178,&local_188);
    if (bVar2) {
      JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::operator->
                ((JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1> *)local_198);
      this_00 = std::
                unique_ptr<Oric::VideoOutput,_JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                ::operator->((unique_ptr<Oric::VideoOutput,_JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                              *)local_198);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator->(&local_178);
      VideoOutput::set_colour_rom(this_00,&ppVar4->second);
      std::
      unique_ptr<Oric::VideoOutput,_JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<Oric::VideoOutput,_JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_198);
    }
    local_1a0._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)&colour_rom,&local_9c);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_1a0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->rom_,&ppVar4->second);
    local_1ac = OricByteDrive500;
    local_1a8._M_node =
         (_Base_ptr)
         std::
         map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)&colour_rom,&local_1ac);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_1a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->disk_rom_,&ppVar4->second);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->rom_);
    this->paged_rom_ = puVar5;
    iVar1 = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 0xc);
    if (iVar1 == 1) {
      DiskController::set_delegate(&(this->microdisc_).super_DiskController,&this->super_Delegate);
    }
    else if (iVar1 == 3) {
      DiskController::set_delegate(&(this->jasmin_).super_DiskController,&this->super_Delegate);
    }
    else if (iVar1 == 4) {
      DiskController::set_delegate(&(this->bd500_).super_DiskController,&this->super_Delegate);
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      type_string(this,(string *)&rom_fetcher_local[4]._M_invoker);
    }
    if (((ulong)rom_fetcher_local[5]._M_invoker & 1) != 0) {
      this->jasmin_reset_counter_ = 3000000;
    }
    iVar1 = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 8);
    if (iVar1 == 0) {
      this->tape_get_byte_address_ = 0xe630;
      this->tape_speed_address_ = 0x67;
    }
    else if (iVar1 - 1U < 2) {
      this->tape_get_byte_address_ = 0xe6c9;
      this->tape_speed_address_ = 0x24d;
    }
    insert_media(this,(Media *)&rom_fetcher_local->_M_invoker);
    std::
    map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)&colour_rom);
    ROM::Request::~Request((Request *)local_98);
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Analyser::Static::Oric::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
				m6502_(*this),
				video_(ram_),
				ay8910_(GI::AY38910::Personality::AY38910, audio_queue_),
				speaker_(ay8910_),
				via_port_handler_(audio_queue_, ay8910_, speaker_, tape_player_, keyboard_),
				via_(via_port_handler_),
				keyboard_(this),
				diskii_(2000000) {
			set_clock_rate(1000000);
			speaker_.set_input_rate(1000000.0f);
			via_port_handler_.set_interrupt_delegate(this);
			tape_player_.set_delegate(this);

			// Slight hack here: I'm unclear what RAM should look like at startup.
			// Actually, I think completely random might be right since the Microdisc
			// sort of assumes it, but also the BD-500 never explicitly sets PAL mode
			// so I can't have any switch-to-NTSC bytes in the display area. Hence:
			// disallow all atributes.
			Memory::Fuzz(ram_, sizeof(ram_));
			for(size_t c = 0; c < sizeof(ram_); ++c) {
				ram_[c] |= 0x40;
			}

			::ROM::Request request = ::ROM::Request(::ROM::Name::OricColourROM, true);
			::ROM::Name basic;
			switch(target.rom) {
				case Analyser::Static::Oric::Target::ROM::BASIC10:	basic = ::ROM::Name::OricBASIC10;		break;
				default:
				case Analyser::Static::Oric::Target::ROM::BASIC11:	basic = ::ROM::Name::OricBASIC11;		break;
				case Analyser::Static::Oric::Target::ROM::Pravetz:	basic = ::ROM::Name::OricPravetzBASIC;	break;
			}
			request = request && ::ROM::Request(basic);

			switch(disk_interface) {
				default: break;
				case DiskInterface::BD500:
					request = request && ::ROM::Request(::ROM::Name::OricByteDrive500);
				break;
				case DiskInterface::Jasmin:
					request = request && ::ROM::Request(::ROM::Name::OricJasmin);
				break;
				case DiskInterface::Microdisc:
					request = request && ::ROM::Request(::ROM::Name::OricMicrodisc);
				break;
				case DiskInterface::Pravetz:
					request = request && ::ROM::Request(::ROM::Name::Oric8DOSBoot) && ::ROM::Request(::ROM::Name::DiskIIStateMachine16Sector);
				break;
			}

			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// The colour ROM is optional; an alternative composite encoding can be used if
			// it is absent.
			const auto colour_rom = roms.find(::ROM::Name::OricColourROM);
			if(colour_rom != roms.end()) {
				video_->set_colour_rom(colour_rom->second);
			}
			rom_ = std::move(roms.find(basic)->second);

			switch(disk_interface) {
				default: break;
				case DiskInterface::BD500:
					disk_rom_ = std::move(roms.find(::ROM::Name::OricByteDrive500)->second);
				break;
				case DiskInterface::Jasmin:
					disk_rom_ = std::move(roms.find(::ROM::Name::OricJasmin)->second);
				break;
				case DiskInterface::Microdisc:
					disk_rom_ = std::move(roms.find(::ROM::Name::OricMicrodisc)->second);
				break;
				case DiskInterface::Pravetz: {
					pravetz_rom_ = std::move(roms.find(::ROM::Name::Oric8DOSBoot)->second);
					pravetz_rom_.resize(512);

					diskii_->set_state_machine(roms.find(::ROM::Name::DiskIIStateMachine16Sector)->second);
				} break;
			}

			paged_rom_ = rom_.data();

			switch(target.disk_interface) {
				default: break;
				case DiskInterface::BD500:
					bd500_.set_delegate(this);
				break;
				case DiskInterface::Jasmin:
					jasmin_.set_delegate(this);
				break;
				case DiskInterface::Microdisc:
					microdisc_.set_delegate(this);
				break;
			}

			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			if(target.should_start_jasmin) {
				// If Jasmin autostart is requested then plan to do so in 3 seconds; empirically long enough
				// for the Oric to boot normally, before the Jasmin intercedes.
				jasmin_reset_counter_ = 3000000;
			}

			switch(target.rom) {
				case Analyser::Static::Oric::Target::ROM::BASIC10:
					tape_get_byte_address_ = 0xe630;
					tape_speed_address_ = 0x67;
				break;
				case Analyser::Static::Oric::Target::ROM::BASIC11:
				case Analyser::Static::Oric::Target::ROM::Pravetz:
					tape_get_byte_address_ = 0xe6c9;
					tape_speed_address_ = 0x024d;
				break;
			}

			insert_media(target.media);
		}